

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMerFactory.hpp
# Opt level: O1

void __thiscall
CStringKMerFactory128::create_kmers_direction
          (CStringKMerFactory128 *this,
          vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
          *mers,char *s)

{
  __uint128_t *p_Var1;
  __uint128_t *p_Var2;
  int64_t *piVar3;
  ulong *puVar4;
  char cVar5;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  undefined8 in_RAX;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool *__args_1;
  byte *pbVar13;
  __uint128_t *__args;
  bool bVar14;
  undefined8 uStack_38;
  
  *(undefined8 *)((long)&(this->super_KMerFactory128).fkmer + 8) = 0;
  *(undefined8 *)&(this->super_KMerFactory128).rkmer = 0;
  (this->super_KMerFactory128).last_unknown = 0;
  *(undefined8 *)&(this->super_KMerFactory128).fkmer = 0;
  *(undefined8 *)((long)&(this->super_KMerFactory128).rkmer + 8) = 0;
  uVar9 = CONCAT71((int7)((ulong)in_RAX >> 8),*s);
  if (*s != '\0') {
    p_Var1 = &(this->super_KMerFactory128).fkmer;
    p_Var2 = &(this->super_KMerFactory128).rkmer;
    pbVar13 = (byte *)(s + 1);
    uStack_38 = uVar9;
    do {
      cVar5 = (this->super_KMerFactory128).b2f._M_elems[uVar9 & 0xff];
      if (cVar5 == '\x04') {
        (this->super_KMerFactory128).last_unknown = 0;
        uVar9 = (ulong)(this->super_KMerFactory128).rkmer;
        lVar7 = *(long *)((long)&(this->super_KMerFactory128).rkmer + 8);
        uVar8 = *(ulong *)((long)&(this->super_KMerFactory128).KMER_MASK + 8);
        *(ulong *)&(this->super_KMerFactory128).rkmer =
             uVar9 << 2 & (ulong)(this->super_KMerFactory128).KMER_MASK;
        *(ulong *)((long)&(this->super_KMerFactory128).rkmer + 8) =
             (lVar7 << 2 | uVar9 >> 0x3e) & uVar8;
        uVar9 = *(ulong *)((long)&(this->super_KMerFactory128).fkmer + 8);
        bVar6 = (byte)(this->super_KMerFactory128).KMER_FIRSTOFFSET;
        uVar11 = (ulong)(this->super_KMerFactory128).fkmer >> 2 | uVar9 << 0x3e;
        uVar12 = 3L << (bVar6 & 0x3f);
        uVar10 = uVar12;
        uVar8 = 0L << (bVar6 & 0x3f) | 3UL >> 0x40 - (bVar6 & 0x3f);
        if ((bVar6 & 0x40) != 0) {
          uVar10 = 0;
          uVar8 = uVar12;
        }
        *(ulong *)&(this->super_KMerFactory128).fkmer = uVar10 + uVar11;
        *(ulong *)((long)&(this->super_KMerFactory128).fkmer + 8) =
             uVar8 + (uVar9 >> 2) + (ulong)CARRY8(uVar10,uVar11);
      }
      else {
        uVar8 = (ulong)(this->super_KMerFactory128).rkmer;
        lVar7 = *(long *)((long)&(this->super_KMerFactory128).rkmer + 8);
        uVar12 = uVar8 * 4;
        uVar11 = (ulong)cVar5;
        uVar10 = *(ulong *)((long)&(this->super_KMerFactory128).KMER_MASK + 8);
        *(ulong *)&(this->super_KMerFactory128).rkmer =
             uVar12 + uVar11 & (ulong)(this->super_KMerFactory128).KMER_MASK;
        *(ulong *)((long)&(this->super_KMerFactory128).rkmer + 8) =
             ((long)uVar11 >> 0x3f) + (lVar7 << 2 | uVar8 >> 0x3e) + (ulong)CARRY8(uVar12,uVar11) &
             uVar10;
        uVar8 = *(ulong *)((long)&(this->super_KMerFactory128).fkmer + 8);
        uVar11 = (ulong)(this->super_KMerFactory128).fkmer >> 2 | uVar8 << 0x3e;
        uVar9 = (ulong)(this->super_KMerFactory128).b2r._M_elems[uVar9 & 0xff];
        bVar6 = (byte)(this->super_KMerFactory128).KMER_FIRSTOFFSET;
        uVar10 = uVar9 << (bVar6 & 0x3f);
        bVar14 = (bVar6 & 0x40) != 0;
        uVar9 = ((long)uVar9 >> 0x3f) << (bVar6 & 0x3f) | uVar9 >> 0x40 - (bVar6 & 0x3f);
        if (bVar14) {
          uVar9 = uVar10;
        }
        uVar12 = 0;
        if (!bVar14) {
          uVar12 = uVar10;
        }
        *(ulong *)&(this->super_KMerFactory128).fkmer = uVar12 + uVar11;
        *(ulong *)((long)&(this->super_KMerFactory128).fkmer + 8) =
             uVar9 + (uVar8 >> 2) + (ulong)CARRY8(uVar12,uVar11);
        piVar3 = &(this->super_KMerFactory128).last_unknown;
        *piVar3 = *piVar3 + 1;
      }
      if ((long)(ulong)(this->super_KMerFactory128).K <= (this->super_KMerFactory128).last_unknown)
      {
        uVar9 = *(ulong *)((long)&(this->super_KMerFactory128).rkmer + 8);
        puVar4 = (ulong *)((long)&(this->super_KMerFactory128).fkmer + 8);
        if (uVar9 < *puVar4 || uVar9 - *puVar4 < (ulong)((ulong)*p_Var2 < (ulong)*p_Var1)) {
          uStack_38._0_7_ = CONCAT16(1,(undefined6)uStack_38);
          __args_1 = (bool *)((long)&uStack_38 + 6);
          __args = p_Var2;
        }
        else {
          uStack_38 = uStack_38 & 0xffffffffffffff;
          __args_1 = (bool *)((long)&uStack_38 + 7);
          __args = p_Var1;
        }
        std::
        vector<std::pair<unsigned__int128,bool>,std::allocator<std::pair<unsigned__int128,bool>>>::
        emplace_back<unsigned__int128&,bool>
                  ((vector<std::pair<unsigned__int128,bool>,std::allocator<std::pair<unsigned__int128,bool>>>
                    *)mers,__args,__args_1);
      }
      bVar6 = *pbVar13;
      uVar9 = (ulong)bVar6;
      pbVar13 = pbVar13 + 1;
    } while (bVar6 != 0);
  }
  return;
}

Assistant:

const void create_kmers_direction(std::vector<std::pair<__uint128_t,bool>> &mers, const char * s) {
        fkmer=0;
        rkmer=0;
        last_unknown=0;
        uint64_t p(0);
        while (s[p]!='\0') {
            //fkmer: grows from the right (LSB)
            //rkmer: grows from the left (MSB)
            fillKBuf(s[p], fkmer, rkmer, last_unknown);
            p++;
            if (last_unknown >= K) {
                if (fkmer <= rkmer) {
                    // Is fwd
                    mers.emplace_back(fkmer,false);
                } else {
                    // Is bwd
                    mers.emplace_back(rkmer,true);
                }
            }
        }
    }